

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# okim6295.c
# Opt level: O0

UINT8 memory_raw_read_byte(okim6295_state *chip,UINT32 offset)

{
  byte local_21;
  uint local_20;
  UINT8 BankID;
  UINT32 CurOfs;
  UINT32 offset_local;
  okim6295_state *chip_local;
  
  if (chip->nmk_mode == '\0') {
    local_20 = chip->bank_offs | offset;
  }
  else {
    if ((offset < 0x400) && ((chip->nmk_mode & 0x80) != 0)) {
      local_21 = (byte)(offset >> 8);
      local_20 = offset & 0x3ff;
    }
    else {
      local_21 = (byte)(offset >> 0x10);
      local_20 = offset & 0xffff;
    }
    local_20 = (uint)chip->nmk_bank[(int)(local_21 & 3)] << 0x10 | local_20;
  }
  if (local_20 < chip->ROMSize) {
    chip_local._7_1_ = chip->ROM[local_20];
  }
  else {
    chip_local._7_1_ = '\0';
  }
  return chip_local._7_1_;
}

Assistant:

static UINT8 memory_raw_read_byte(okim6295_state *chip, UINT32 offset)
{
	UINT32 CurOfs;
	
	if (! chip->nmk_mode)
	{
		CurOfs = chip->bank_offs | offset;
	}
	else
	{
		UINT8 BankID;
		
		if (offset < NMK_TABLESIZE && (chip->nmk_mode & 0x80))
		{
			// pages sample table
			BankID = offset >> NMK_BNKTBLBITS;
			CurOfs = offset & NMK_TABLEMASK;	// 0x3FF, not 0xFF
		}
		else
		{
			BankID = offset >> NMK_BANKBITS;
			CurOfs = offset & NMK_BANKMASK;
		}
		CurOfs |= (chip->nmk_bank[BankID & 0x03] << NMK_BANKBITS);
	}
	if (CurOfs < chip->ROMSize)
		return chip->ROM[CurOfs];
	else
		return 0x00;
}